

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  
  iVar3 = p->nTravIds;
  if (pObj->TravId != iVar3) {
    do {
      pObj->TravId = iVar3;
      uVar5 = (uint)*(ulong *)&pObj->field_0x18;
      uVar2 = uVar5 & 7;
      if (uVar2 == 2) {
LAB_0063fd04:
        if (p->pReprs == (Aig_Obj_t **)0x0) {
          return;
        }
        if (p->pReprs[pObj->Id] == (Aig_Obj_t *)0x0) {
          return;
        }
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                        ,0x291,"void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)"
                       );
        }
        if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) != 0) {
          uVar5 = 0;
          uVar2 = 0xffffffff;
          do {
            if (uVar5 == 0) {
              if (p->nFansAlloc <= pObj->Id) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar3 = pObj->Id * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar2 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar3 = (uVar2 & 1) + ((int)uVar2 >> 1) * 5 + 3;
            }
            pVVar1 = p->vObjs;
            uVar2 = p->pFanData[iVar3];
            if (pVVar1 == (Vec_Ptr_t *)0x0) {
              pObj_00 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar4 = (int)uVar2 >> 1;
              if (((int)uVar4 < 0) || (pVVar1->nSize <= (int)uVar4)) goto LAB_0063fe0d;
              pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar4];
            }
            Saig_StrSimSetContiguousMatching_rec(p,pObj_00);
            uVar5 = uVar5 + 1;
          } while (uVar5 < ((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff));
          uVar2 = (uint)*(ulong *)&pObj->field_0x18 & 7;
        }
        if (uVar2 == 2) {
          return;
        }
        Saig_StrSimSetContiguousMatching_rec
                  (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        iVar3 = p->nTravIds;
      }
      else {
        if (uVar2 != 3) {
          if ((uVar5 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                          ,0x28d,
                          "void Saig_StrSimSetContiguousMatching_rec(Aig_Man_t *, Aig_Obj_t *)");
          }
          goto LAB_0063fd04;
        }
        if ((pObj->field_0).CioId < p->nTruePos) {
          return;
        }
        uVar2 = ((pObj->field_0).CioId - p->nTruePos) + p->nTruePis;
        if (((int)uVar2 < 0) || (p->vCis->nSize <= (int)uVar2)) {
LAB_0063fe0d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj = (Aig_Obj_t *)p->vCis->pArray[uVar2];
      }
    } while (pObj->TravId != iVar3);
  }
  return;
}

Assistant:

void Saig_StrSimSetContiguousMatching_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsPo( p, pObj ) )
        return;
    if ( Saig_ObjIsLi( p, pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Saig_ObjLiToLo(p, pObj) );
        return;
    }
    assert( Aig_ObjIsCi(pObj) || Aig_ObjIsNode(pObj) );
    if ( Aig_ObjRepr(p, pObj) == NULL )
        return;
    // go through the fanouts
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_StrSimSetContiguousMatching_rec( p, pFanout );
    // go through the fanins
    if ( !Aig_ObjIsCi( pObj ) )
    {
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin0(pObj) );
        Saig_StrSimSetContiguousMatching_rec( p, Aig_ObjFanin1(pObj) );
    }
}